

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SmallVector.h
# Opt level: O0

reference __thiscall
slang::
SmallVectorBase<std::tuple<slang::ast::Symbol_const*,std::variant<slang::ast::Expression_const*,slang::ast::AssertionExpr_const*,slang::ast::TimingControl_const*>>>
::
emplace_back<std::tuple<slang::ast::Symbol_const*,std::variant<slang::ast::Expression_const*,slang::ast::AssertionExpr_const*,slang::ast::TimingControl_const*>>>
          (SmallVectorBase<std::tuple<const_slang::ast::Symbol_*,_std::variant<const_slang::ast::Expression_*,_const_slang::ast::AssertionExpr_*,_const_slang::ast::TimingControl_*>_>_>
           *this,tuple<const_slang::ast::Symbol_*,_std::variant<const_slang::ast::Expression_*,_const_slang::ast::AssertionExpr_*,_const_slang::ast::TimingControl_*>_>
                 *args)

{
  SmallVectorBase<std::tuple<const_slang::ast::Symbol_*,_std::variant<const_slang::ast::Expression_*,_const_slang::ast::AssertionExpr_*,_const_slang::ast::TimingControl_*>_>_>
  *in_RDI;
  tuple<const_slang::ast::Symbol_*,_std::variant<const_slang::ast::Expression_*,_const_slang::ast::AssertionExpr_*,_const_slang::ast::TimingControl_*>_>
  *in_stack_00000020;
  pointer in_stack_00000028;
  SmallVectorBase<std::tuple<const_slang::ast::Symbol_*,_std::variant<const_slang::ast::Expression_*,_const_slang::ast::AssertionExpr_*,_const_slang::ast::TimingControl_*>_>_>
  *in_stack_00000030;
  tuple<const_slang::ast::Symbol_*,_std::variant<const_slang::ast::Expression_*,_const_slang::ast::AssertionExpr_*,_const_slang::ast::TimingControl_*>_>
  *in_stack_ffffffffffffffd8;
  pointer local_8;
  
  if (in_RDI->len == in_RDI->cap) {
    SmallVectorBase<std::tuple<const_slang::ast::Symbol_*,_std::variant<const_slang::ast::Expression_*,_const_slang::ast::AssertionExpr_*,_const_slang::ast::TimingControl_*>_>_>
    ::end(in_RDI);
    local_8 = emplaceRealloc<std::tuple<slang::ast::Symbol_const*,std::variant<slang::ast::Expression_const*,slang::ast::AssertionExpr_const*,slang::ast::TimingControl_const*>>>
                        (in_stack_00000030,in_stack_00000028,in_stack_00000020);
  }
  else {
    SmallVectorBase<std::tuple<const_slang::ast::Symbol_*,_std::variant<const_slang::ast::Expression_*,_const_slang::ast::AssertionExpr_*,_const_slang::ast::TimingControl_*>_>_>
    ::end(in_RDI);
    std::
    tuple<const_slang::ast::Symbol_*,_std::variant<const_slang::ast::Expression_*,_const_slang::ast::AssertionExpr_*,_const_slang::ast::TimingControl_*>_>
    ::tuple((tuple<const_slang::ast::Symbol_*,_std::variant<const_slang::ast::Expression_*,_const_slang::ast::AssertionExpr_*,_const_slang::ast::TimingControl_*>_>
             *)in_RDI,in_stack_ffffffffffffffd8);
    in_RDI->len = in_RDI->len + 1;
    local_8 = SmallVectorBase<std::tuple<const_slang::ast::Symbol_*,_std::variant<const_slang::ast::Expression_*,_const_slang::ast::AssertionExpr_*,_const_slang::ast::TimingControl_*>_>_>
              ::back(in_RDI);
  }
  return local_8;
}

Assistant:

reference emplace_back(Args&&... args) {
        if (len == cap)
            return *emplaceRealloc(end(), std::forward<Args>(args)...);

        new (end()) T(std::forward<Args>(args)...);
        len++;
        return back();
    }